

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::utp_socket_manager::remove_udp_socket
          (utp_socket_manager *this,weak_ptr<libtorrent::aux::utp_socket_interface> *sock)

{
  int iVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr this_01;
  element_type *peVar5;
  element_type *peVar6;
  bool bVar7;
  
  this_00 = (sock->
            super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar7 = iVar3 == iVar1;
      if (bVar7) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar7);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar7 = true;
  }
  else {
    bVar7 = this_00->_M_use_count == 0;
  }
  if (bVar7) {
    peVar5 = (element_type *)0x0;
  }
  else {
    peVar5 = (sock->
             super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  }
  p_Var4 = (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header) {
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        return;
      }
      return;
    }
    p_Var2 = p_Var4[1]._M_parent;
    this_01 = p_Var2->_M_parent;
    if (this_01 != (_Base_ptr)0x0) {
      iVar3 = *(int *)&this_01->_M_parent;
      do {
        if (iVar3 == 0) {
          this_01 = (_Base_ptr)0x0;
          break;
        }
        LOCK();
        iVar1 = *(int *)&this_01->_M_parent;
        bVar7 = iVar3 == iVar1;
        if (bVar7) {
          *(int *)&this_01->_M_parent = iVar3 + 1;
          iVar1 = iVar3;
        }
        iVar3 = iVar1;
        UNLOCK();
      } while (!bVar7);
    }
    if (this_01 == (_Base_ptr)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = *(int *)&this_01->_M_parent == 0;
    }
    if (bVar7) {
      peVar6 = (element_type *)0x0;
    }
    else {
      peVar6 = *(element_type **)p_Var2;
    }
    if (this_01 != (_Base_ptr)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (peVar6 == peVar5) {
      utp_socket_impl::abort((utp_socket_impl *)p_Var4[1]._M_parent);
    }
    p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void utp_socket_manager::remove_udp_socket(std::weak_ptr<utp_socket_interface> sock)
	{
		auto iface = sock.lock();
		for (auto& s : m_utp_sockets)
		{
			if (s.second->m_sock.lock() != iface)
				continue;

			s.second->abort();
		}
	}